

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

FaceData * __thiscall
Ptex::v2_2::PtexReader::TiledFaceBase::reduce
          (TiledFaceBase *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  _func_int *p_Var1;
  code *pcVar2;
  long lVar3;
  FaceData *pFVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  TiledFaceBase *pTVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  void *pvVar15;
  undefined4 extraout_var_00;
  ulong uVar16;
  EVP_PKEY_CTX *dst_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar17;
  EVP_PKEY_CTX *src;
  Res *pRVar18;
  undefined8 uStackY_1d0;
  DataType aDStackY_1c8 [2];
  undefined8 local_1b8;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  TiledFaceBase *in_stack_fffffffffffffe58;
  ReduceFn *pRVar19;
  PtexReader *in_stack_fffffffffffffe60;
  TiledReducedFace *in_stack_fffffffffffffe68;
  int iStack_190;
  undefined4 in_stack_fffffffffffffe74;
  undefined8 local_188;
  int local_180;
  undefined4 local_17c;
  FaceData *local_178;
  int local_170;
  int local_16c;
  char *local_168;
  int local_15c;
  int local_158;
  int local_154;
  void *local_150;
  ReduceFn *local_148;
  char *local_140;
  int local_134;
  FaceData *local_130;
  int local_128;
  int local_124;
  void *local_120;
  FaceData *local_118;
  void *local_110;
  bool local_102;
  bool local_101;
  TiledFaceBase *local_100;
  Res local_f4;
  Res local_f2;
  FaceData *local_f0;
  TiledReducedFace *tf;
  long *plStack_e0;
  int i_3;
  PtexFaceData *tile_2;
  void *pvStack_d0;
  int i_2;
  char *dst;
  int dstepv_1;
  int dstepu;
  int dstride_1;
  int sstride_1;
  int tilevres_1;
  int tileures_1;
  Res local_a6;
  int memsize_1;
  long *plStack_a0;
  int memsize;
  PtexFaceData *tile_1;
  char *pcStack_90;
  int i_1;
  char *tmpptr;
  char *tmp;
  int dstepv;
  int dstride;
  int sstride;
  int tilevres;
  int tileures;
  long *local_60;
  PtexFaceData *tile;
  int i;
  bool allConstant;
  PtexFaceData **tiles;
  int local_40;
  byte local_3b;
  Res local_3a;
  int newntiles;
  bool isTriangle;
  Res newtileres;
  FaceData *newface;
  size_t *newMemUsed_local;
  ReduceFn *reducefn_local;
  PtexReader *r_local;
  TiledFaceBase *this_local;
  Res newres_local;
  long *plVar14;
  
  _newntiles = (FaceData *)0x0;
  local_100 = this;
  this_local._6_2_ = newres;
  Res::Res(&local_3a);
  local_3b = (r->_header).meshtype == 0;
  if ((bool)local_3b) {
    local_3a = this_local._6_2_;
  }
  else {
    local_3a = local_100->_tileres;
    if (this_local._6_1_ < local_3a.ulog2) {
      local_3a.ulog2 = this_local._6_1_;
    }
    if (this_local._7_1_ < local_3a.vlog2) {
      local_3a.vlog2 = this_local._7_1_;
    }
  }
  tiles._6_2_ = local_3a;
  local_40 = Res::ntiles((Res *)in_stack_fffffffffffffe58,
                         SUB82((ulong)in_stack_fffffffffffffe60 >> 0x30,0));
  if (local_40 == 1) {
    lVar3 = -((long)local_100->_ntiles * 8 + 0xfU & 0xfffffffffffffff0);
    _i = (undefined8 *)((long)&local_1b8 + lVar3);
    tile._7_1_ = true;
    for (tile._0_4_ = 0; pTVar9 = local_100, (int)(uint)tile < local_100->_ntiles;
        tile._0_4_ = (uint)tile + 1) {
      uVar16 = (ulong)(uint)tile;
      p_Var1 = (local_100->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf631a;
      iVar10 = (*p_Var1)(pTVar9,uVar16);
      plVar14 = (long *)CONCAT44(extraout_var,iVar10);
      _i[(int)(uint)tile] = plVar14;
      local_60 = plVar14;
      local_101 = false;
      if ((tile._7_1_ & 1) != 0) {
        pcVar2 = *(code **)(*plVar14 + 0x18);
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6342;
        uVar11 = (*pcVar2)();
        local_101 = false;
        if ((uVar11 & 1) != 0) {
          local_102 = true;
          if ((uint)tile != 0) {
            pcVar2 = *(code **)(*(long *)*_i + 0x30);
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf636e;
            local_110 = (void *)(*pcVar2)();
            pcVar2 = *(code **)(*local_60 + 0x30);
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf637f;
            pvVar15 = (void *)(*pcVar2)();
            pvVar8 = local_110;
            iVar10 = local_100->_pixelsize;
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6399;
            iVar10 = memcmp(pvVar8,pvVar15,(long)iVar10);
            local_102 = iVar10 == 0;
          }
          local_101 = local_102;
        }
      }
      tile._7_1_ = local_101;
    }
    if ((bool)tile._7_1_ == false) {
      if ((local_3b & 1) == 0) {
        local_17c = local_100->_pixelsize;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf67f3;
        iVar10 = Res::size(*(Res **)(&stack0xfffffffffffffe50 + lVar3));
        tileures_1 = local_17c * iVar10;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf680e;
        local_178 = (FaceData *)operator_new(0x18);
        tilevres_1._2_2_ = this_local._6_2_;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6842;
        PackedFace::PackedFace
                  (*(PackedFace **)((long)&local_188 + lVar3),*(Res *)((long)&local_17c + lVar3 + 2)
                   ,*(int *)(&stack0xfffffffffffffe74 + lVar3),*(int *)((long)&iStack_190 + lVar3));
        _newntiles = local_178;
        *newMemUsed = (long)tileures_1 + 0x18;
        pRVar18 = &local_100->_tileres;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6871;
        sstride_1 = Res::u(pRVar18);
        pRVar18 = &local_100->_tileres;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6887;
        dstride_1 = Res::v(pRVar18);
        dstepu = local_100->_pixelsize * sstride_1;
        local_188._4_4_ = local_100->_pixelsize;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf68b8;
        local_180 = Res::u((Res *)((long)&this_local + 6));
        local_180 = local_188._4_4_ * local_180;
        dst._4_4_ = local_180 / local_100->_ntilesu;
        dstepv_1 = local_180;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf68f5;
        iVar10 = Res::v((Res *)((long)&this_local + 6));
        dst._0_4_ = (local_180 * iVar10) / local_100->_ntilesv -
                    dst._4_4_ * (local_100->_ntilesu + -1);
        p_Var1 = (_newntiles->super_PtexFaceData)._vptr_PtexFaceData[6];
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6933;
        iVar10 = (*p_Var1)();
        pvStack_d0 = (void *)CONCAT44(extraout_var_02,iVar10);
        tile_2._4_4_ = 0;
        while (tile_2._4_4_ < local_100->_ntiles) {
          plStack_e0 = (long *)_i[tile_2._4_4_];
          pcVar2 = *(code **)(*plStack_e0 + 0x18);
          *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf697d;
          uVar16 = (*pcVar2)();
          if ((uVar16 & 1) == 0) {
            pcVar2 = *(code **)(*plStack_e0 + 0x30);
            pRVar19 = reducefn;
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6a4f;
            pvVar15 = (void *)(*pcVar2)();
            iVar13 = sstride_1;
            iVar7 = dstride_1;
            iVar6 = dstepu;
            iVar12 = dstepv_1;
            pvVar8 = pvStack_d0;
            iVar10 = local_100->_nchan;
            *(DataType *)((long)aDStackY_1c8 + lVar3) = local_100->_dt;
            *(int *)(&stack0xfffffffffffffe40 + lVar3) = iVar10;
            *(undefined8 *)((long)&uStackY_1d0 + lVar3) = 0xaf6a97;
            (*pRVar19)(pvVar15,iVar6,iVar13,iVar7,pvVar8,iVar12,
                       *(DataType *)((long)aDStackY_1c8 + lVar3),
                       *(int *)(&stack0xfffffffffffffe40 + lVar3));
          }
          else {
            pcVar2 = *(code **)(*plStack_e0 + 0x30);
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6993;
            (*pcVar2)();
            local_188._0_4_ = dstepv_1;
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf69bd;
            Res::u((Res *)((long)&this_local + 6));
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf69d7;
            Res::v((Res *)((long)&this_local + 6));
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6a10;
            PtexUtils::fill(*(void **)((long)&iStack_190 + lVar3),
                            *(void **)(&stack0xfffffffffffffe68 + lVar3),
                            *(int *)(&stack0xfffffffffffffe64 + lVar3),
                            *(int *)(&stack0xfffffffffffffe60 + lVar3),
                            *(int *)(&stack0xfffffffffffffe5c + lVar3),
                            *(int *)(&stack0xfffffffffffffe58 + lVar3));
          }
          tile_2._4_4_ = tile_2._4_4_ + 1;
          iVar10 = (int)dst;
          if (tile_2._4_4_ % local_100->_ntilesu != 0) {
            iVar10 = dst._4_4_;
          }
          pvStack_d0 = (void *)((long)pvStack_d0 + (long)iVar10);
        }
      }
      else {
        pRVar18 = &local_100->_tileres;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6499;
        sstride = Res::u(pRVar18);
        pRVar18 = &local_100->_tileres;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf64ac;
        dstride = Res::v(pRVar18);
        dstepv = local_100->_pixelsize * sstride;
        tmp._4_4_ = dstepv * local_100->_ntilesu;
        tmp._0_4_ = tmp._4_4_ * dstride - dstepv * (local_100->_ntilesu + -1);
        local_124 = local_100->_ntiles;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf64f4;
        iVar12 = Res::size(*(Res **)(&stack0xfffffffffffffe50 + lVar3));
        iVar12 = local_124 * iVar12;
        iVar10 = local_100->_pixelsize;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6512;
        tmpptr = (char *)operator_new__((long)(iVar12 * iVar10));
        pcStack_90 = tmpptr;
        tile_1._4_4_ = 0;
        while (tile_1._4_4_ < local_100->_ntiles) {
          plStack_a0 = (long *)_i[tile_1._4_4_];
          pcVar2 = *(code **)(*plStack_a0 + 0x18);
          *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6564;
          uVar16 = (*pcVar2)();
          if ((uVar16 & 1) == 0) {
            pcVar2 = *(code **)(*plStack_a0 + 0x30);
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf65aa;
            dst_00 = (EVP_PKEY_CTX *)(*pcVar2)();
            src = (EVP_PKEY_CTX *)(ulong)(uint)dstepv;
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf65c7;
            PtexUtils::copy(dst_00,src);
          }
          else {
            pcVar2 = *(code **)(*plStack_a0 + 0x30);
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6577;
            (*pcVar2)();
            *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf659b;
            PtexUtils::fill(*(void **)((long)&iStack_190 + lVar3),
                            *(void **)(&stack0xfffffffffffffe68 + lVar3),
                            *(int *)(&stack0xfffffffffffffe64 + lVar3),
                            *(int *)(&stack0xfffffffffffffe60 + lVar3),
                            *(int *)(&stack0xfffffffffffffe5c + lVar3),
                            *(int *)(&stack0xfffffffffffffe58 + lVar3));
          }
          tile_1._4_4_ = tile_1._4_4_ + 1;
          if (tile_1._4_4_ % local_100->_ntilesu == 0) {
            local_128 = (int)tmp;
          }
          else {
            local_128 = dstepv;
          }
          pcStack_90 = pcStack_90 + local_128;
        }
        local_134 = local_100->_pixelsize;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6638;
        iVar10 = Res::size(*(Res **)(&stack0xfffffffffffffe50 + lVar3));
        memsize_1 = local_134 * iVar10;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6653;
        local_130 = (FaceData *)operator_new(0x18);
        local_a6 = this_local._6_2_;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6687;
        PackedFace::PackedFace
                  (*(PackedFace **)((long)&local_188 + lVar3),*(Res *)((long)&local_17c + lVar3 + 2)
                   ,*(int *)(&stack0xfffffffffffffe74 + lVar3),*(int *)((long)&iStack_190 + lVar3));
        _newntiles = local_130;
        *newMemUsed = (long)memsize_1 + 0x18;
        local_168 = tmpptr;
        local_170 = local_100->_pixelsize;
        pFVar4 = &local_100->super_FaceData;
        local_148 = reducefn;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf66d5;
        local_15c = Res::u(&pFVar4->_res);
        local_15c = local_170 * local_15c;
        pFVar4 = &local_100->super_FaceData;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf66f6;
        local_158 = Res::u(&pFVar4->_res);
        pFVar4 = &local_100->super_FaceData;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf670c;
        local_154 = Res::v(&pFVar4->_res);
        p_Var1 = (_newntiles->super_PtexFaceData)._vptr_PtexFaceData[6];
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf671c;
        iVar10 = (*p_Var1)();
        local_150 = (void *)CONCAT44(extraout_var_01,iVar10);
        local_16c = local_100->_pixelsize;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf673f;
        iVar13 = Res::u((Res *)((long)&this_local + 6));
        pRVar19 = local_148;
        pvVar8 = local_150;
        iVar7 = local_154;
        iVar6 = local_158;
        iVar12 = local_15c;
        pcVar5 = local_168;
        iVar13 = local_16c * iVar13;
        iVar10 = local_100->_nchan;
        *(DataType *)((long)aDStackY_1c8 + lVar3) = local_100->_dt;
        *(int *)(&stack0xfffffffffffffe40 + lVar3) = iVar10;
        *(undefined8 *)((long)&uStackY_1d0 + lVar3) = 0xaf6792;
        (*pRVar19)(pcVar5,iVar12,iVar6,iVar7,pvVar8,iVar13,*(DataType *)((long)aDStackY_1c8 + lVar3)
                   ,*(int *)(&stack0xfffffffffffffe40 + lVar3));
        pcVar5 = tmpptr;
        local_140 = tmpptr;
        if (tmpptr != (char *)0x0) {
          *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf67b3;
          operator_delete__(pcVar5);
        }
      }
    }
    else {
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf63e1;
      local_118 = (FaceData *)operator_new(0x18);
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf63fd;
      ConstantFace::ConstantFace
                (*(ConstantFace **)(&stack0xfffffffffffffe50 + lVar3),
                 *(int *)((long)&local_1b8 + lVar3 + 4));
      _newntiles = local_118;
      p_Var1 = (local_118->super_PtexFaceData)._vptr_PtexFaceData[6];
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6414;
      iVar10 = (*p_Var1)();
      local_120 = (void *)CONCAT44(extraout_var_00,iVar10);
      pcVar2 = *(code **)(*(long *)*_i + 0x30);
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6428;
      pvVar15 = (void *)(*pcVar2)();
      pvVar8 = local_120;
      iVar10 = local_100->_pixelsize;
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6442;
      memcpy(pvVar8,pvVar15,(long)iVar10);
      *newMemUsed = (long)local_100->_pixelsize + 0x18;
    }
    for (tf._4_4_ = 0; tf._4_4_ < local_100->_ntiles; tf._4_4_ = tf._4_4_ + 1) {
      pcVar2 = *(code **)(*(long *)_i[tf._4_4_] + 0x10);
      *(undefined8 *)(&stack0xfffffffffffffe40 + lVar3) = 0xaf6b2e;
      (*pcVar2)();
    }
  }
  else {
    local_1b8 = (FaceData *)operator_new(0x60);
    local_f2 = this_local._6_2_;
    local_f4 = local_3a;
    TiledReducedFace::TiledReducedFace
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               SUB42((uint)in_stack_fffffffffffffe74 >> 0x10,0),SUB42(in_stack_fffffffffffffe74,0),
               in_stack_fffffffffffffe58,
               (ReduceFn *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    local_f0 = local_1b8;
    _newntiles = local_1b8;
    sVar17 = TiledReducedFace::memUsed((TiledReducedFace *)0xaf6bba);
    *newMemUsed = sVar17;
  }
  return _newntiles;
}

Assistant:

PtexReader::FaceData*
PtexReader::TiledFaceBase::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                                  size_t& newMemUsed)
{
    /* Tiled reductions should generally only be anisotropic (just u
       or v, not both) since isotropic reductions are precomputed and
       stored on disk.  (This function should still work for isotropic
       reductions though.)

       In the anisotropic case, the number of tiles should be kept the
       same along the direction not being reduced in order to preserve
       the laziness of the file access.  In contrast, if reductions
       were not tiled, then any reduction would read all the tiles and
       defeat the purpose of tiling.
    */

    // keep new face local until fully initialized
    FaceData* newface = 0;

    // don't tile triangle reductions (too complicated)
    Res newtileres;
    bool isTriangle = r->_header.meshtype == mt_triangle;
    if (isTriangle) {
        newtileres = newres;
    }
    else {
        // propagate the tile res to the reduction
        newtileres = _tileres;
        // but make sure tile isn't larger than the new face!
        if (newtileres.ulog2 > newres.ulog2) newtileres.ulog2 = newres.ulog2;
        if (newtileres.vlog2 > newres.vlog2) newtileres.vlog2 = newres.vlog2;
    }


    // determine how many tiles we will have on the reduction
    int newntiles = newres.ntiles(newtileres);

    if (newntiles == 1) {
        // no need to keep tiling, reduce tiles into a single face
        // first, get all tiles and check if they are constant (with the same value)
        PtexFaceData** tiles = (PtexFaceData**) alloca(_ntiles * sizeof(PtexFaceData*));
        bool allConstant = true;
        for (int i = 0; i < _ntiles; i++) {
            PtexFaceData* tile = tiles[i] = getTile(i);
            allConstant = (allConstant && tile->isConstant() &&
                           (i == 0 || (0 == memcmp(tiles[0]->getData(), tile->getData(),
                                                   _pixelsize))));
        }
        if (allConstant) {
            // allocate a new constant face
            newface = new ConstantFace(_pixelsize);
            memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
        }
        else if (isTriangle) {
            // reassemble all tiles into temporary contiguous image
            // (triangle reduction doesn't work on tiles)
            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = sstride * _ntilesu;
            int dstepv = dstride * tilevres - sstride*(_ntilesu-1);

            char* tmp = new char [_ntiles * _tileres.size() * _pixelsize];
            char* tmpptr = tmp;
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), tmpptr, dstride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(tile->getData(), sstride, tmpptr, dstride, tilevres, sstride);
                i++;
                tmpptr += (i%_ntilesu) ? sstride : dstepv;
            }

            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;
            // reduce and copy into new face
            reducefn(tmp, _pixelsize * _res.u(), _res.u(), _res.v(),
                     newface->getData(), _pixelsize * newres.u(), _dt, _nchan);

            delete [] tmp;
        }
        else {
            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;

            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = _pixelsize * newres.u();
            int dstepu = dstride/_ntilesu;
            int dstepv = dstride*newres.v()/_ntilesv - dstepu*(_ntilesu-1);

            char* dst = (char*) newface->getData();
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), dst, dstride,
                                    newres.u()/_ntilesu, newres.v()/_ntilesv,
                                    _pixelsize);
                else
                    reducefn(tile->getData(), sstride, tileures, tilevres,
                             dst, dstride, _dt, _nchan);
                i++;
                dst += (i%_ntilesu) ? dstepu : dstepv;
            }
        }
        // release the tiles
        for (int i = 0; i < _ntiles; i++) tiles[i]->release();
    }
    else {
        // otherwise, tile the reduced face
        TiledReducedFace* tf = new TiledReducedFace(_reader, newres, newtileres, this, reducefn);
        newface = tf;
        newMemUsed = tf->memUsed();
    }
    return newface;
}